

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainAI.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::TrainAI::makePath(TrainAI *this,World *world)

{
  bool bVar1;
  int iVar2;
  PostType PVar3;
  PostType PVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  IPost *pIVar8;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar9;
  reference ppIVar10;
  undefined4 extraout_var;
  IPost *pIVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  World *in_RSI;
  TrainAI *in_RDI;
  int predict;
  int tempLen;
  IPost *post;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *__range2;
  int killer;
  Point *tempNext;
  double maxProductByTick;
  int currHomeLen;
  Town *homeTown;
  Point *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  PathCalculator *in_stack_ffffffffffffff48;
  PathCalculator *in_stack_ffffffffffffff50;
  Point *in_stack_ffffffffffffff90;
  PathCalculator *in_stack_ffffffffffffff98;
  TrainAI *this_00;
  __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
  local_48;
  int in_stack_ffffffffffffffc8;
  int iVar12;
  Train *train;
  HomeChecker *this_01;
  
  trains::world::Train::getPlayer(in_RDI->train);
  pIVar8 = trains::world::Player::getHome((Player *)0x24ba25);
  (*pIVar8->_vptr_IPost[5])();
  iVar2 = PathCalculator::getMinLen
                    ((PathCalculator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                     ,in_stack_ffffffffffffff38);
  this_01 = (HomeChecker *)0x0;
  train = (Train *)0x0;
  iVar12 = 0;
  pvVar9 = trains::world::World::getPostList(in_RSI);
  local_48._M_current =
       (IPost **)
       std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
       begin((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
              *)in_stack_ffffffffffffff38);
  std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::end
            ((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
              *)in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    ppIVar10 = __gnu_cxx::
               __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
               ::operator*(&local_48);
    this_00 = (TrainAI *)*ppIVar10;
    PVar3 = (*(this_00->super_ISubBot)._vptr_ISubBot[7])();
    PVar4 = getPostTypeByGood(in_RDI,in_RDI->type);
    if (PVar3 == PVar4) {
      (*(this_00->super_ISubBot)._vptr_ISubBot[5])();
      iVar5 = PathCalculator::getMinLen
                        ((PathCalculator *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
      if (iVar5 != 0x7fffffff) {
        in_stack_ffffffffffffff50 = &in_RDI->pathCalculator;
        (*(this_00->super_ISubBot)._vptr_ISubBot[5])();
        iVar5 = PathCalculator::getMinLen
                          ((PathCalculator *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38);
        (*pIVar8->_vptr_IPost[5])();
        iVar6 = PathCalculator::getMinLen
                          ((PathCalculator *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38);
        iVar6 = iVar5 * 2 + iVar6;
        BotSharedData::getCheker(in_RDI->sharedData);
        bVar1 = HomeChecker::needHome
                          (this_01,train,iVar12,in_stack_ffffffffffffffc8,
                           (GoodType)((ulong)pvVar9 >> 0x20));
        if (!bVar1) {
          in_stack_ffffffffffffff48 = &in_RDI->pathCalculator;
          (*(this_00->super_ISubBot)._vptr_ISubBot[5])();
          PathCalculator::getMinLen
                    ((PathCalculator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                     ,in_stack_ffffffffffffff38);
          iVar5 = calculateProducts(this_00,iVar6,(IPost *)in_stack_ffffffffffffff98);
          if ((double)this_01 < (double)iVar5 / (double)((iVar6 - iVar2) + 1)) {
            iVar7 = (*(this_00->super_ISubBot)._vptr_ISubBot[5])();
            train = (Train *)CONCAT44(extraout_var,iVar7);
            this_01 = (HomeChecker *)((double)iVar5 / (double)((iVar6 - iVar2) + 1));
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
    ::operator++(&local_48);
  }
  if (train == (Train *)0x0) {
    trains::world::Train::getPlayer(in_RDI->train);
    pIVar11 = trains::world::Player::getHome((Player *)0x24bcc5);
    iVar2 = (*pIVar11->_vptr_IPost[5])();
    in_RDI->nextPoint = (Point *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    in_RDI->nextPoint = (Point *)train;
  }
  iVar2 = trains::world::Train::getGoods(in_RDI->train);
  iVar12 = trains::world::Train::getGoodsCapacity(in_RDI->train);
  if (iVar12 <= iVar2) {
    iVar2 = (*pIVar8->_vptr_IPost[5])();
    in_RDI->nextPoint = (Point *)CONCAT44(extraout_var_01,iVar2);
  }
  PathCalculator::getMinPath(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::operator=((vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
               *)in_stack_ffffffffffffff50,
              (vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
               *)in_stack_ffffffffffffff48);
  std::
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::~vector((vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
             *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void TrainAI::makePath(const world::World &world)
{

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    int currHomeLen = pathCalculator.getMinLen(homeTown->getPoint());
    double maxProductByTick = 0;
    world::Point *tempNext = nullptr;
    int killer = 0;

    while(true)
    {
        for (auto post : world.getPostList())
        {
            if (post->getPostType() != getPostTypeByGood(type)
                    || pathCalculator.getMinLen(post->getPoint()) == INT_MAX
               )//  || train->getPoint() == post->getPoint())
                continue;

            int tempLen = pathCalculator.getMinLen(post->getPoint())*2
                          + pathCalculator.getMinLen(homeTown->getPoint()); // TODO DIJKSTRA for MARKET/TOWN

            if (sharedData->getCheker()->needHome(train,tempLen - killer, currHomeLen, type))
                continue;




            int predict =  calculateProducts(pathCalculator.getMinLen(post->getPoint()), post);

            if (((double)predict)/(tempLen-currHomeLen + 1) > maxProductByTick)
            {
                tempNext = post->getPoint();
                maxProductByTick = ((double)predict)/(tempLen-currHomeLen + 1);
            }

        }

//        if (lastPoint != homeTown->getPoint() || maxProductByTick > homeTown->getPopulation() -  killer)
        break;

//        killer++;
    }

    if (tempNext == nullptr)
        nextPoint = train->getPlayer()->getHome()->getPoint();
    else
        nextPoint = tempNext;


    if (train->getGoods() >= train->getGoodsCapacity())
        nextPoint = homeTown->getPoint();

    currentPath = pathCalculator.getMinPath(nextPoint);

}